

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ant.cpp
# Opt level: O0

void __thiscall imrt::Ant::Ant(Ant *this,Ant *a)

{
  void *pvVar1;
  long in_RSI;
  undefined8 *in_RDI;
  Plan *in_stack_00000058;
  Plan *in_stack_00000060;
  
  std::
  vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::vector((vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
            *)0x1430e6);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x1430f9);
  in_RDI[7] = *(undefined8 *)(in_RSI + 0x38);
  pvVar1 = operator_new(0xd0);
  Plan::Plan(in_stack_00000060,in_stack_00000058);
  *in_RDI = pvVar1;
  std::
  vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::operator=((vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
               *)in_stack_00000060,
              (vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
               *)in_stack_00000058);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_00000060,
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_00000058);
  *(undefined4 *)((long)in_RDI + 0x44) = *(undefined4 *)(in_RSI + 0x44);
  *(undefined4 *)(in_RDI + 8) = *(undefined4 *)(in_RSI + 0x40);
  *(undefined4 *)(in_RDI + 9) = *(undefined4 *)(in_RSI + 0x48);
  *(undefined4 *)((long)in_RDI + 0x4c) = *(undefined4 *)(in_RSI + 0x4c);
  return;
}

Assistant:

Ant::Ant(const Ant& a): collimator(a.collimator) {
    p = new Plan (*(a.p));
    ref_plan = a.ref_plan;
    ref_intensity= a.ref_intensity;
    n_stations = a.n_stations;
    n_apertures = a.n_apertures;
    step_intensity= a.step_intensity;
    max_intensity=a.max_intensity;
  }